

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_setuid_fails(void)

{
  __uid_t _Var1;
  int iVar2;
  int extraout_EAX;
  anon_union_8_2_26168aa3_for_data aVar3;
  undefined8 uVar4;
  ssize_t sVar5;
  uv_buf_t *buf;
  uv_process_options_t *unaff_RBX;
  uv_process_t *puVar6;
  uv_process_t *puVar7;
  code *nread;
  uv_timer_t *puVar8;
  undefined1 auStack_530 [16];
  uv_handle_type uStack_520;
  undefined4 uStack_518;
  undefined4 uStack_508;
  uv_stream_t uStack_4f0;
  anon_union_8_2_26168aa3_for_data aStack_3e8;
  int iStack_3d4;
  uv_stdio_container_t uStack_3d0;
  undefined1 auStack_3b8 [16];
  undefined1 auStack_3a8 [264];
  undefined1 auStack_2a0 [440];
  undefined1 auStack_e8 [192];
  anon_union_8_2_26168aa3_for_data aStack_28;
  
  _Var1 = getuid();
  if (_Var1 == 0) {
    aVar3.stream = (uv_stream_t *)getpwnam("nobody");
    if (aVar3.stream == (uv_stream_t *)0x0) goto LAB_0016e722;
    iVar2 = setgid(*(__gid_t *)&(aVar3.stream)->field_0x14);
    unaff_RBX = (uv_process_options_t *)aVar3.stream;
    if (iVar2 != 0) goto LAB_0016e727;
    iVar2 = setuid((aVar3.stream)->type);
    if (iVar2 == 0) goto LAB_0016e673;
  }
  else {
LAB_0016e673:
    init_process_options("spawn_helper1",fail_cb);
    unaff_RBX = &options;
    options.uid = 0;
    options.flags._0_1_ = (byte)options.flags | 0x75;
    uVar4 = uv_default_loop();
    iVar2 = uv_spawn(uVar4,&process,&options);
    if (iVar2 == -1) {
      uVar4 = uv_default_loop();
      iVar2 = uv_run(uVar4);
      if (iVar2 != 0) goto LAB_0016e713;
      if (close_cb_called != 0) goto LAB_0016e718;
      unaff_RBX = (uv_process_options_t *)uv_default_loop();
      uv_walk(unaff_RBX,close_walk_cb,0);
      uv_run(unaff_RBX);
      uVar4 = uv_default_loop();
      iVar2 = uv_loop_close(uVar4);
      if (iVar2 == 0) {
        return 0;
      }
    }
    else {
      run_test_spawn_setuid_fails_cold_3();
LAB_0016e713:
      run_test_spawn_setuid_fails_cold_4();
LAB_0016e718:
      run_test_spawn_setuid_fails_cold_5();
    }
    run_test_spawn_setuid_fails_cold_6();
LAB_0016e722:
    run_test_spawn_setuid_fails_cold_7();
LAB_0016e727:
    run_test_spawn_setuid_fails_cold_1();
  }
  run_test_spawn_setuid_fails_cold_2();
  _Var1 = getuid();
  if (_Var1 == 0) {
    aVar3.stream = (uv_stream_t *)getpwnam("nobody");
    if (aVar3.stream == (uv_stream_t *)0x0) goto LAB_0016e822;
    iVar2 = setgid(*(__gid_t *)&(aVar3.stream)->field_0x14);
    unaff_RBX = (uv_process_options_t *)aVar3.stream;
    if (iVar2 != 0) goto LAB_0016e827;
    iVar2 = setuid((aVar3.stream)->type);
    if (iVar2 == 0) goto LAB_0016e773;
  }
  else {
LAB_0016e773:
    init_process_options("spawn_helper1",fail_cb);
    unaff_RBX = &options;
    options.flags._0_1_ = (byte)options.flags | 2;
    options.gid = 0;
    uVar4 = uv_default_loop();
    iVar2 = uv_spawn(uVar4,&process,&options);
    if (iVar2 == -1) {
      uVar4 = uv_default_loop();
      iVar2 = uv_run(uVar4);
      if (iVar2 != 0) goto LAB_0016e813;
      if (close_cb_called != 0) goto LAB_0016e818;
      unaff_RBX = (uv_process_options_t *)uv_default_loop();
      uv_walk(unaff_RBX,close_walk_cb,0);
      uv_run(unaff_RBX);
      uVar4 = uv_default_loop();
      iVar2 = uv_loop_close(uVar4);
      if (iVar2 == 0) {
        return 0;
      }
    }
    else {
      run_test_spawn_setgid_fails_cold_3();
LAB_0016e813:
      run_test_spawn_setgid_fails_cold_4();
LAB_0016e818:
      run_test_spawn_setgid_fails_cold_5();
    }
    run_test_spawn_setgid_fails_cold_6();
LAB_0016e822:
    run_test_spawn_setgid_fails_cold_7();
LAB_0016e827:
    run_test_spawn_setgid_fails_cold_1();
  }
  run_test_spawn_setgid_fails_cold_2();
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  uVar4 = uv_default_loop();
  iVar2 = uv_spawn(uVar4,&process,&options);
  if (iVar2 == 0) {
    uVar4 = uv_default_loop();
    iVar2 = uv_run(uVar4,0);
    if (iVar2 != 0) goto LAB_0016e8f5;
    iVar2 = uv_is_closing(&process);
    if (iVar2 != 0) goto LAB_0016e8fa;
    uv_close(&process,0);
    uVar4 = uv_default_loop();
    iVar2 = uv_run(uVar4,0);
    if (iVar2 != 0) goto LAB_0016e8ff;
    iVar2 = uv_is_closing(&process);
    if (iVar2 != 1) goto LAB_0016e904;
    unaff_RBX = (uv_process_options_t *)uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar4 = uv_default_loop();
    iVar2 = uv_loop_close(uVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_auto_unref_cold_1();
LAB_0016e8f5:
    run_test_spawn_auto_unref_cold_2();
LAB_0016e8fa:
    run_test_spawn_auto_unref_cold_3();
LAB_0016e8ff:
    run_test_spawn_auto_unref_cold_4();
LAB_0016e904:
    run_test_spawn_auto_unref_cold_5();
  }
  run_test_spawn_auto_unref_cold_6();
  nread = (code *)auStack_2a0;
  aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16e939;
  aStack_28 = (anon_union_8_2_26168aa3_for_data)unaff_RBX;
  iStack_3d4 = uv_fs_open(0,nread,"/dev/null",2,0,0);
  if (iStack_3d4 < 0) {
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16ea96;
    run_test_spawn_fs_open_cold_1();
LAB_0016ea96:
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16ea9b;
    run_test_spawn_fs_open_cold_2();
LAB_0016ea9b:
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16eaa0;
    run_test_spawn_fs_open_cold_3();
LAB_0016eaa0:
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16eaa5;
    run_test_spawn_fs_open_cold_4();
LAB_0016eaa5:
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16eaaa;
    run_test_spawn_fs_open_cold_5();
LAB_0016eaaa:
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16eaaf;
    run_test_spawn_fs_open_cold_6();
LAB_0016eaaf:
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16eab4;
    run_test_spawn_fs_open_cold_7();
LAB_0016eab4:
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16eab9;
    run_test_spawn_fs_open_cold_8();
  }
  else {
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16e952;
    uv_fs_req_cleanup(auStack_2a0);
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16e965;
    init_process_options("spawn_helper8",exit_cb);
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16e96a;
    uVar4 = uv_default_loop();
    unaff_RBX = (uv_process_options_t *)auStack_3a8;
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16e97c;
    nread = (code *)unaff_RBX;
    iVar2 = uv_pipe_init(uVar4,unaff_RBX,0);
    if (iVar2 != 0) goto LAB_0016ea96;
    options.stdio = &uStack_3d0;
    uStack_3d0.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16e9b0;
    uStack_3d0.data.stream = (uv_stream_t *)unaff_RBX;
    uVar4 = uv_default_loop();
    puVar6 = &process;
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16e9c2;
    iVar2 = uv_spawn(uVar4,&process,&options);
    nread = (code *)puVar6;
    if (iVar2 != 0) goto LAB_0016ea9b;
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16e9d9;
    auStack_3b8 = uv_buf_init(&iStack_3d4,4);
    nread = (code *)auStack_3a8;
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16ea06;
    iVar2 = uv_write(auStack_e8,nread,auStack_3b8,1,write_cb);
    if (iVar2 != 0) goto LAB_0016eaa0;
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16ea13;
    uVar4 = uv_default_loop();
    nread = (code *)0x0;
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16ea1d;
    iVar2 = uv_run(uVar4);
    if (iVar2 != 0) goto LAB_0016eaa5;
    nread = (code *)auStack_2a0;
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16ea3a;
    iVar2 = uv_fs_close(0,nread,iStack_3d4,0);
    if (iVar2 != 0) goto LAB_0016eaaa;
    if (exit_cb_called != 1) goto LAB_0016eaaf;
    if (close_cb_called != 2) goto LAB_0016eab4;
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16ea55;
    unaff_RBX = (uv_process_options_t *)uv_default_loop();
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16ea69;
    uv_walk(unaff_RBX,close_walk_cb,0);
    nread = (code *)0x0;
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16ea73;
    uv_run(unaff_RBX);
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16ea78;
    uVar4 = uv_default_loop();
    aStack_3e8 = (anon_union_8_2_26168aa3_for_data)0x16ea80;
    iVar2 = uv_loop_close(uVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  aStack_3e8.stream = (uv_stream_t *)run_test_closed_fd_events;
  run_test_spawn_fs_open_cold_9();
  puVar6 = (uv_process_t *)auStack_530;
  aStack_3e8 = (anon_union_8_2_26168aa3_for_data)unaff_RBX;
  iVar2 = pipe((int *)puVar6);
  if (iVar2 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = (uv_stdio_container_t *)(auStack_530 + 8);
    auStack_530._8_4_ = 2;
    uStack_520 = auStack_530._0_4_;
    uStack_518 = 0;
    uStack_508 = 0;
    puVar6 = (uv_process_t *)uv_default_loop();
    puVar7 = &process;
    iVar2 = uv_spawn(puVar6,&process,&options);
    nread = (code *)puVar7;
    if (iVar2 != 0) goto LAB_0016ed02;
    uv_unref(&process);
    puVar6 = (uv_process_t *)uv_default_loop();
    nread = (code *)&uStack_4f0;
    iVar2 = uv_pipe_init(puVar6,nread,0);
    if (iVar2 != 0) goto LAB_0016ed07;
    nread._4_4_ = 0;
    nread._0_4_ = auStack_530._0_4_;
    puVar6 = (uv_process_t *)&uStack_4f0;
    iVar2 = uv_pipe_open();
    if (iVar2 != 0) goto LAB_0016ed0c;
    auStack_530._0_4_ = ~UV_UNKNOWN_HANDLE;
    nread = on_alloc;
    puVar6 = (uv_process_t *)&uStack_4f0;
    iVar2 = uv_read_start(puVar6,on_alloc,on_read_once);
    if (iVar2 != 0) goto LAB_0016ed11;
    puVar6 = (uv_process_t *)(ulong)(uint)auStack_530._4_4_;
    nread = (code *)0x1802fd;
    sVar5 = write(auStack_530._4_4_,"",1);
    if (sVar5 != 1) goto LAB_0016ed16;
    puVar6 = (uv_process_t *)uv_default_loop();
    nread = (code *)0x1;
    iVar2 = uv_run();
    if (iVar2 != 0) goto LAB_0016ed1b;
    if (output_used != 1) goto LAB_0016ed20;
    uv_close(&uStack_4f0,close_cb);
    puVar6 = (uv_process_t *)(ulong)(uint)auStack_530._4_4_;
    nread = (code *)0x1802fd;
    sVar5 = write(auStack_530._4_4_,"",1);
    if (sVar5 != 1) goto LAB_0016ed25;
    puVar6 = (uv_process_t *)uv_default_loop();
    puVar8 = &timer;
    iVar2 = uv_timer_init();
    nread = (code *)puVar8;
    if (iVar2 != 0) goto LAB_0016ed2a;
    puVar8 = &timer;
    nread = timer_counter_cb;
    iVar2 = uv_timer_start(&timer,timer_counter_cb,10,0);
    puVar6 = (uv_process_t *)puVar8;
    if (iVar2 != 0) goto LAB_0016ed2f;
    puVar6 = (uv_process_t *)uv_default_loop();
    nread = (code *)0x1;
    iVar2 = uv_run();
    if (iVar2 == 1) {
      puVar6 = (uv_process_t *)uv_default_loop();
      nread = (code *)0x1;
      iVar2 = uv_run();
      if (iVar2 != 0) goto LAB_0016ed48;
    }
    if (timer_counter != 1) goto LAB_0016ed34;
    puVar6 = &process;
    nread = (code *)0xf;
    iVar2 = uv_process_kill();
    if (iVar2 != 0) goto LAB_0016ed39;
    puVar6 = (uv_process_t *)(ulong)(uint)auStack_530._4_4_;
    iVar2 = close(auStack_530._4_4_);
    if (iVar2 != 0) goto LAB_0016ed3e;
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    nread = (code *)0x0;
    uv_run(uVar4);
    puVar6 = (uv_process_t *)uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_0016ed02:
    run_test_closed_fd_events_cold_2();
LAB_0016ed07:
    run_test_closed_fd_events_cold_3();
LAB_0016ed0c:
    run_test_closed_fd_events_cold_4();
LAB_0016ed11:
    run_test_closed_fd_events_cold_5();
LAB_0016ed16:
    run_test_closed_fd_events_cold_6();
LAB_0016ed1b:
    run_test_closed_fd_events_cold_7();
LAB_0016ed20:
    run_test_closed_fd_events_cold_8();
LAB_0016ed25:
    run_test_closed_fd_events_cold_9();
LAB_0016ed2a:
    run_test_closed_fd_events_cold_10();
LAB_0016ed2f:
    run_test_closed_fd_events_cold_11();
LAB_0016ed34:
    run_test_closed_fd_events_cold_13();
LAB_0016ed39:
    run_test_closed_fd_events_cold_14();
LAB_0016ed3e:
    run_test_closed_fd_events_cold_15();
  }
  run_test_closed_fd_events_cold_16();
LAB_0016ed48:
  run_test_closed_fd_events_cold_12();
  uv_read_stop();
  on_read((uv_stream_t *)puVar6,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_setuid_fails) {
  int r;

  /* if root, become nobody. */
  uv_uid_t uid = getuid();
  if (uid == 0) {
    struct passwd* pw;
    pw = getpwnam("nobody");
    ASSERT(pw != NULL);
    ASSERT(0 == setgid(pw->pw_gid));
    ASSERT(0 == setuid(pw->pw_uid));
  }

  init_process_options("spawn_helper1", fail_cb);

  options.flags |= UV_PROCESS_SETUID;
  options.uid = 0;

  /* These flags should be ignored on Unices. */
  options.flags |= UV_PROCESS_WINDOWS_HIDE;
  options.flags |= UV_PROCESS_WINDOWS_HIDE_CONSOLE;
  options.flags |= UV_PROCESS_WINDOWS_HIDE_GUI;
  options.flags |= UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS;

  r = uv_spawn(uv_default_loop(), &process, &options);
#if defined(__CYGWIN__)
  ASSERT(r == UV_EINVAL);
#else
  ASSERT(r == UV_EPERM);
#endif

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}